

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O0

GenericVec4
deqp::gls::anon_unknown_1::RandomArrayGenerator::generateAttributeValue(int seed,InputType type)

{
  Vector<float,_4> local_80;
  Vector<unsigned_int,_4> local_70;
  Vector<int,_4> local_60;
  undefined4 local_50;
  Vector<float,_4> local_40;
  undefined1 local_30 [8];
  Random random;
  InputType type_local;
  int seed_local;
  
  random.m_rnd.z = type;
  random.m_rnd.w = seed;
  de::Random::Random((Random *)local_30,seed);
  if (random.m_rnd.z == 0) {
    generateRandomVec4((anon_unknown_1 *)&local_40,(Random *)local_30);
    rr::GenericVec4::GenericVec4<float>((GenericVec4 *)&type_local,&local_40);
  }
  else if (random.m_rnd.z == 7) {
    generateRandomIVec4((anon_unknown_1 *)&local_60,(Random *)local_30);
    rr::GenericVec4::GenericVec4<int>((GenericVec4 *)&type_local,&local_60);
  }
  else if (random.m_rnd.z == 8) {
    generateRandomUVec4((anon_unknown_1 *)&local_70,(Random *)local_30);
    rr::GenericVec4::GenericVec4<unsigned_int>((GenericVec4 *)&type_local,&local_70);
  }
  else {
    tcu::Vector<float,_4>::Vector(&local_80,1.0,1.0,1.0,1.0);
    rr::GenericVec4::GenericVec4<float>((GenericVec4 *)&type_local,&local_80);
  }
  local_50 = 1;
  de::Random::~Random((Random *)local_30);
  return (GenericVec4)_type_local;
}

Assistant:

rr::GenericVec4	RandomArrayGenerator::generateAttributeValue (int seed, DrawTestSpec::InputType type)
{
	de::Random random(seed);

	switch (type)
	{
		case DrawTestSpec::INPUTTYPE_FLOAT:
			return rr::GenericVec4(generateRandomVec4(random));

		case DrawTestSpec::INPUTTYPE_INT:
			return rr::GenericVec4(generateRandomIVec4(random));

		case DrawTestSpec::INPUTTYPE_UNSIGNED_INT:
			return rr::GenericVec4(generateRandomUVec4(random));

		default:
			DE_ASSERT(false);
			return rr::GenericVec4(tcu::Vec4(1, 1, 1, 1));
	}
}